

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

MDD make_random_ldd_set(int depth,int maxvalue,int elements)

{
  undefined8 uVar1;
  long amount;
  long lVar2;
  size_t count;
  uint32_t uVar3;
  MDD MVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  int iVar7;
  long lStack_50;
  MDD local_48;
  size_t local_40;
  int local_34;
  
  lVar2 = -((ulong)(uint)depth * 4 + 0xf & 0xfffffffffffffff0);
  MVar4 = 0;
  local_40 = (long)depth;
  uVar5 = 0;
  if (0 < depth) {
    uVar5 = (ulong)(uint)depth;
  }
  if (maxvalue < 1) {
    maxvalue = 0;
  }
  local_34 = maxvalue;
  *(undefined8 *)((long)&lStack_50 + lVar2) = 10;
  uVar1 = *(undefined8 *)((long)&lStack_50 + lVar2);
  for (iVar7 = 0; iVar7 != local_34; iVar7 = iVar7 + 1) {
    local_48 = MVar4;
    *(undefined8 *)((long)&lStack_50 + lVar2) = 0x104780;
    lddmc_refs_push(MVar4);
    for (uVar6 = 0; count = local_40, MVar4 = local_48, uVar5 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined8 *)((long)&lStack_50 + lVar2) = 0x104792;
      uVar3 = rng(0,(int)uVar1);
      ((uint32_t *)((long)&local_48 + lVar2))[uVar6] = uVar3;
    }
    *(undefined8 *)((long)&lStack_50 + lVar2) = 0x1047ab;
    MVar4 = lddmc_union_cube(MVar4,(uint32_t *)((long)&local_48 + lVar2),count);
    *(undefined8 *)((long)&lStack_50 + lVar2) = 1;
    amount = *(long *)((long)&lStack_50 + lVar2);
    *(undefined8 *)((long)&lStack_50 + lVar2) = 0x1047b6;
    lddmc_refs_pop(amount);
  }
  return MVar4;
}

Assistant:

static MDD
make_random_ldd_set(int depth, int maxvalue, int elements)
{
    uint32_t values[depth];
    MDD result = mtbdd_false; // empty set
    for (int i=0; i<elements; i++) {
        lddmc_refs_push(result);
        for (int j=0; j<depth; j++) {
            values[j] = rng(0, maxvalue);
        }
        result = lddmc_union_cube(result, values, depth);
        lddmc_refs_pop(1);
    }
    return result;
}